

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initLexYaccFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *pQVar1;
  ProStringList *pPVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  ProKey local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).LexYaccFiles;
  QVar3.m_size = (size_t)"Lex / Yacc Files";
  QVar3.field_0.m_data = this_00;
  QString::assign(QVar3);
  (this->vcProject).LexYaccFiles.ParseFiles = _False;
  QVar4.m_size = (size_t)"l;y";
  QVar4.field_0.m_data = &(this->vcProject).LexYaccFiles.Filter;
  QString::assign(QVar4);
  QVar5.m_size = (size_t)"{E12AE0D2-192F-4d59-BD23-7D3FA58D3183}";
  QVar5.field_0.m_data = &(this->vcProject).LexYaccFiles.Guid;
  QString::assign(QVar5);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"LEXSOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_58);
  VCFilter::addFiles(this_00,pPVar2);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"YACCSOURCES");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_58);
  VCFilter::addFiles(this_00,pPVar2);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->vcProject).LexYaccFiles.Project = this;
  (this->vcProject).LexYaccFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initLexYaccFiles()
{
    vcProject.LexYaccFiles.Name = "Lex / Yacc Files";
    vcProject.LexYaccFiles.ParseFiles = _False;
    vcProject.LexYaccFiles.Filter = "l;y";
    vcProject.LexYaccFiles.Guid = _GUIDLexYaccFiles;

    vcProject.LexYaccFiles.addFiles(project->values("LEXSOURCES"));
    vcProject.LexYaccFiles.addFiles(project->values("YACCSOURCES"));

    vcProject.LexYaccFiles.Project = this;
    vcProject.LexYaccFiles.Config = &(vcProject.Configuration);
}